

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

i8 __thiscall idx2::DecodeTransformOrder(idx2 *this,u64 Input,v3i N3,str Output)

{
  long lVar1;
  undefined8 uVar2;
  idx2 *piVar3;
  ulong uVar4;
  long lVar5;
  char local_115;
  char local_10d;
  char local_105;
  int T;
  idx2 *local_e8;
  u64 SavedInput;
  undefined4 uStack_d8;
  i8 Len;
  str Output_local;
  u64 Input_local;
  undefined8 local_b0;
  v3i N3_local;
  int local_78;
  undefined4 local_68;
  undefined4 local_58;
  
  lVar5 = CONCAT44((int)((ulong)register0x00000008 >> 0x20),N3.field_0._8_4_);
  local_b0._0_4_ = (int)Input;
  if ((long)(int)local_b0 == 0) {
    local_58 = 1;
  }
  else {
    uVar4 = (long)(int)local_b0 - 1;
    if (uVar4 == 0) {
      local_105 = -1;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_105 = '?' - ((byte)lVar1 ^ 0x3f);
    }
    local_58 = (undefined4)(1L << (local_105 + 1U & 0x3f));
  }
  local_b0._4_4_ = (int)(Input >> 0x20);
  if ((long)local_b0._4_4_ == 0) {
    local_68 = 1;
  }
  else {
    uVar4 = (long)local_b0._4_4_ - 1;
    if (uVar4 == 0) {
      local_10d = -1;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_10d = '?' - ((byte)lVar1 ^ 0x3f);
    }
    local_68 = (undefined4)(1L << (local_10d + 1U & 0x3f));
  }
  if ((long)N3.field_0._0_4_ == 0) {
    local_78 = 1;
  }
  else {
    uVar4 = (long)N3.field_0._0_4_ - 1;
    if (uVar4 == 0) {
      local_115 = -1;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_115 = '?' - ((byte)lVar1 ^ 0x3f);
    }
    local_78 = (int)(1L << (local_115 + 1U & 0x3f));
  }
  SavedInput._4_4_ = local_58;
  uStack_d8 = local_68;
  local_b0 = unique0x10000133;
  uVar2 = local_b0;
  N3_local.field_0.field_0.X = local_78;
  SavedInput._3_1_ = '\0';
  piVar3 = this;
  Output_local = (str)this;
  while( true ) {
    while( true ) {
      local_e8 = piVar3;
      local_b0._0_4_ = (int)unique0x10000133;
      local_b0._4_4_ = (int)((ulong)unique0x10000133 >> 0x20);
      if ((ulong)((long)(int)local_b0 * (long)local_b0._4_4_ * (long)local_78) < 2) {
        *(undefined1 *)(lVar5 + SavedInput._3_1_) = 0;
        return SavedInput._3_1_;
      }
      N3_local.field_0.field_0.Y = (uint)Output_local & 3;
      Output_local = (str)((ulong)Output_local >> 2);
      if (N3_local.field_0.field_0.Y != 3) break;
      piVar3 = (idx2 *)Output_local;
      if ((idx2 *)Output_local == (idx2 *)0x3) {
        piVar3 = local_e8;
        Output_local = (str)local_e8;
      }
    }
    *(char *)(lVar5 + SavedInput._3_1_) = (char)N3_local.field_0.field_0.Y + 'X';
    unique0x00004880 = &local_b0;
    if (2 < (uint)N3_local.field_0.field_0.Y) break;
    *(int *)((long)unique0x00004880 + (long)N3_local.field_0.field_0.Y * 4) =
         *(int *)((long)unique0x00004880 + (long)N3_local.field_0.field_0.Y * 4) >> 1;
    piVar3 = local_e8;
    SavedInput._3_1_ = SavedInput._3_1_ + '\x01';
  }
  local_b0 = uVar2;
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

i8
DecodeTransformOrder(u64 Input, v3i N3, str Output)
{
  N3 = v3i((int)NextPow2(N3.X), (int)NextPow2(N3.Y), (int)NextPow2(N3.Z));
  i8 Len = 0;
  u64 SavedInput = Input;
  while (Prod<u64>(N3) > 1)
  {
    int T = Input & 0x3;
    Input >>= 2;
    if (T == 3)
    {
      if (Input == 3)
        Input = SavedInput;
      else
        SavedInput = Input;
    }
    else
    {
      Output[Len++] = char('X' + T);
      N3[T] >>= 1;
    }
  }
  Output[Len] = '\0';
  return Len;
}